

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O0

CRYPTO_BUFFER * CRYPTO_BUFFER_alloc(uint8_t **out_data,size_t len)

{
  uint8_t *puVar1;
  CRYPTO_BUFFER *buf;
  size_t len_local;
  uint8_t **out_data_local;
  
  out_data_local = (uint8_t **)OPENSSL_zalloc(0x20);
  if (out_data_local == (uint8_t **)0x0) {
    out_data_local = (uint8_t **)0x0;
  }
  else {
    puVar1 = (uint8_t *)OPENSSL_malloc(len);
    out_data_local[1] = puVar1;
    if ((len == 0) || (out_data_local[1] != (uint8_t *)0x0)) {
      out_data_local[2] = (uint8_t *)len;
      *(undefined4 *)(out_data_local + 3) = 1;
      *out_data = out_data_local[1];
    }
    else {
      OPENSSL_free(out_data_local);
      out_data_local = (uint8_t **)0x0;
    }
  }
  return (CRYPTO_BUFFER *)out_data_local;
}

Assistant:

CRYPTO_BUFFER *CRYPTO_BUFFER_alloc(uint8_t **out_data, size_t len) {
  CRYPTO_BUFFER *const buf =
      reinterpret_cast<CRYPTO_BUFFER *>(OPENSSL_zalloc(sizeof(CRYPTO_BUFFER)));
  if (buf == NULL) {
    return NULL;
  }

  buf->data = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (len != 0 && buf->data == NULL) {
    OPENSSL_free(buf);
    return NULL;
  }
  buf->len = len;
  buf->references = 1;

  *out_data = buf->data;
  return buf;
}